

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O1

void printBits(char *c,half h)

{
  int i;
  uint uVar1;
  unsigned_short b;
  int iVar2;
  bool bVar3;
  
  uVar1 = 0xf;
  iVar2 = 0;
  do {
    c[iVar2] = (h._h >> (uVar1 & 0x1f) & 1) == 0 ^ 0x31;
    if ((uVar1 == 0xf) || (uVar1 == 10)) {
      c[(long)iVar2 + 1] = ' ';
      iVar2 = iVar2 + 1;
    }
    iVar2 = iVar2 + 1;
    bVar3 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar3);
  c[0x12] = '\0';
  return;
}

Assistant:

IMATH_EXPORT void
printBits (char c[19], half h)
{
    unsigned short b = h.bits ();

    for (int i = 15, j = 0; i >= 0; i--, j++)
    {
        c[j] = (((b >> i) & 1) ? '1' : '0');

        if (i == 15 || i == 10) c[++j] = ' ';
    }

    c[18] = 0;
}